

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

bool UnitTest::ArrayAreClose<float[2],float_const*,float>
               (float (*expected) [2],float **actual,int count,float *tolerance)

{
  bool bVar1;
  int local_30;
  bool local_29;
  int i;
  bool equal;
  float *tolerance_local;
  int count_local;
  float **actual_local;
  float (*expected_local) [2];
  
  local_29 = true;
  for (local_30 = 0; local_30 < count; local_30 = local_30 + 1) {
    bVar1 = AreClose<float,float,float>(*expected + local_30,*actual + local_30,tolerance);
    local_29 = (local_29 & bVar1) != 0;
  }
  return local_29;
}

Assistant:

bool ArrayAreClose(Expected const& expected, Actual const& actual, int const count, Tolerance const& tolerance)
{
    bool equal = true;
    for (int i = 0; i < count; ++i)
        equal &= AreClose(expected[i], actual[i], tolerance);
    return equal;
}